

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *in_RSI;
  undefined8 *in_RDI;
  Mat top_blob_bordered;
  Mat top_blob_tm;
  int tiles;
  int h_tiles;
  int w_tiles;
  Mat bottom_blob_tm;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int inch;
  int h;
  int w;
  Option *in_stack_00000990;
  Mat *in_stack_00000998;
  Mat *in_stack_000009a0;
  int in_stack_000009ac;
  Mat *in_stack_000009b0;
  int in_stack_fffffffffffffba4;
  size_t in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  int _c;
  void **ppvVar3;
  undefined8 in_stack_fffffffffffffbb8;
  Allocator *pAVar4;
  Mat *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  Mat *pMVar5;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  Mat *in_stack_fffffffffffffbd8;
  Mat *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbf0;
  Option *in_stack_fffffffffffffbf8;
  Mat local_3c8;
  void *local_380;
  int *local_378;
  undefined8 local_370;
  undefined4 local_368;
  long *local_360;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined8 local_340;
  void *local_338;
  int *local_330;
  undefined8 local_328;
  undefined4 local_320;
  long *local_318;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined8 local_2f8;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Allocator local_2e0;
  int *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  void *local_288;
  int *local_280;
  undefined8 local_278;
  undefined4 local_270;
  long *local_268;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined8 local_248;
  int local_240;
  uint local_23c;
  uint local_238;
  undefined4 local_234;
  undefined8 local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  Mat *local_200;
  Allocator *local_1f0;
  void **local_1e8;
  void **local_1e0;
  Mat *local_1d8;
  void **local_1d0;
  Mat *local_1c0;
  Option *in_stack_fffffffffffffe48;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  Option *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  
  _c = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  local_224 = *(undefined4 *)(in_RDI + 7);
  local_230 = in_RDI[2];
  local_234 = *(undefined4 *)(in_RDI + 3);
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_240 = in_RSI->c;
  local_288 = (void *)*in_RDI;
  local_280 = (int *)in_RDI[1];
  local_278 = in_RDI[2];
  local_270 = *(undefined4 *)(in_RDI + 3);
  local_268 = (long *)in_RDI[4];
  local_260 = *(undefined4 *)(in_RDI + 5);
  local_25c = *(undefined4 *)((long)in_RDI + 0x2c);
  local_258 = *(undefined4 *)(in_RDI + 6);
  local_254 = *(undefined4 *)((long)in_RDI + 0x34);
  local_250 = *(undefined4 *)(in_RDI + 7);
  local_248 = in_RDI[8];
  if (local_280 != (int *)0x0) {
    LOCK();
    *local_280 = *local_280 + 1;
    UNLOCK();
  }
  local_238 = (iVar1 + 1) - (iVar1 + 1 >> 0x1f) & 0xfffffffe;
  local_23c = (iVar2 + 1) - (iVar2 + 1 >> 0x1f) & 0xfffffffe;
  local_21c = local_238 + 2;
  local_220 = local_23c + 2;
  local_200 = in_RSI;
  copy_make_border(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                   in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (int)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbf0,
                   (float)((ulong)in_stack_fffffffffffffbc0 >> 0x20),in_stack_fffffffffffffbf8);
  pAVar4 = &local_2e0;
  local_2e0._vptr_Allocator = (_func_int **)0x0;
  local_2d8 = (int *)0x0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2c0 = (long *)0x0;
  local_2b8 = 0;
  local_2b4 = 0;
  local_2b0 = 0;
  local_2ac = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_2e4 = (int)local_238 / 2;
  local_2e8 = (int)local_23c / 2;
  local_2ec = local_2e4 * local_2e8;
  local_1f0 = pAVar4;
  Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
              (int)in_stack_fffffffffffffbb8,_c,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
              pAVar4);
  conv3x3s1_winograd23_transform_input_pack4_sse
            ((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_1e8 = &local_338;
  local_338 = (void *)0x0;
  local_330 = (int *)0x0;
  local_328 = 0;
  local_320 = 0;
  local_318 = (long *)0x0;
  local_310 = 0;
  local_30c = 0;
  local_308 = 0;
  local_304 = 0;
  local_300 = 0;
  local_2f8 = 0;
  if (&local_288 != &local_338) {
    if (local_280 != (int *)0x0) {
      LOCK();
      iVar1 = *local_280;
      *local_280 = *local_280 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_268 == (long *)0x0) {
          if (local_288 != (void *)0x0) {
            free(local_288);
          }
        }
        else {
          (**(code **)(*local_268 + 0x18))(local_268,local_288);
        }
      }
    }
    local_288 = local_338;
    local_280 = local_330;
    local_278 = local_328;
    local_270 = local_320;
    local_268 = local_318;
    local_260 = local_310;
    local_25c = local_30c;
    local_258 = local_308;
    local_254 = local_304;
    local_250 = local_300;
    local_248 = local_2f8;
  }
  local_1d0 = &local_338;
  if (local_330 != (int *)0x0) {
    LOCK();
    iVar1 = *local_330;
    *local_330 = *local_330 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_318 == (long *)0x0) {
        if (local_338 != (void *)0x0) {
          free(local_338);
        }
      }
      else {
        (**(code **)(*local_318 + 0x18))(local_318,local_338);
      }
    }
  }
  local_338 = (void *)0x0;
  local_328 = 0;
  local_320 = 0;
  local_310 = 0;
  local_30c = 0;
  local_308 = 0;
  local_304 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_330 = (int *)0x0;
  local_1e0 = &local_380;
  local_380 = (void *)0x0;
  local_378 = (int *)0x0;
  local_370 = 0;
  local_368 = 0;
  local_360 = (long *)0x0;
  local_358 = 0;
  local_354 = 0;
  local_350 = 0;
  local_34c = 0;
  local_348 = 0;
  local_340 = 0;
  convolution_winograd_dot_pack4_sse
            (in_stack_000009b0,in_stack_000009ac,in_stack_000009a0,in_stack_00000998,
             in_stack_00000990);
  pMVar5 = &local_3c8;
  local_3c8.data = (void *)0x0;
  local_3c8.refcount = (int *)0x0;
  local_3c8.elemsize = 0;
  local_3c8.elempack = 0;
  local_3c8.allocator = (Allocator *)0x0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_3c8.h = 0;
  local_3c8.d = 0;
  local_3c8.c = 0;
  local_3c8.cstep = 0;
  local_1d8 = pMVar5;
  if ((local_238 == local_200->w) && (local_23c == local_200->h)) {
    if (&local_3c8 != local_200) {
      if (local_200->refcount != (int *)0x0) {
        LOCK();
        *local_200->refcount = *local_200->refcount + 1;
        UNLOCK();
      }
      local_3c8.data = local_200->data;
      local_3c8.refcount = local_200->refcount;
      local_3c8.elemsize = local_200->elemsize;
      local_3c8.elempack = local_200->elempack;
      local_3c8.allocator = local_200->allocator;
      local_3c8.dims = local_200->dims;
      local_3c8.w = local_200->w;
      local_3c8.h = local_200->h;
      local_3c8.d = local_200->d;
      local_3c8.c = local_200->c;
      local_3c8.cstep = local_200->cstep;
      in_stack_fffffffffffffbe0 = &local_3c8;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                (int)in_stack_fffffffffffffbb8,_c,in_stack_fffffffffffffba8,
                in_stack_fffffffffffffba4,pAVar4);
  }
  conv3x3s1_winograd23_transform_output_pack4_sse
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  copy_cut_border(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                  in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                  (int)in_stack_fffffffffffffbc8,(Option *)pMVar5);
  pMVar5 = &local_3c8;
  local_1c0 = pMVar5;
  if (local_3c8.refcount != (int *)0x0) {
    LOCK();
    iVar1 = *local_3c8.refcount;
    *local_3c8.refcount = *local_3c8.refcount + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])(local_3c8.allocator,local_3c8.data);
      }
    }
  }
  pMVar5->data = (void *)0x0;
  pMVar5->elemsize = 0;
  pMVar5->elempack = 0;
  pMVar5->dims = 0;
  pMVar5->w = 0;
  pMVar5->h = 0;
  pMVar5->d = 0;
  pMVar5->c = 0;
  pMVar5->cstep = 0;
  pMVar5->refcount = (int *)0x0;
  ppvVar3 = &local_380;
  if (local_378 != (int *)0x0) {
    LOCK();
    iVar1 = *local_378;
    *local_378 = *local_378 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_360 == (long *)0x0) {
        if (local_380 != (void *)0x0) {
          free(local_380);
        }
      }
      else {
        (**(code **)(*local_360 + 0x18))(local_360,local_380);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  pAVar4 = &local_2e0;
  if (local_2d8 != (int *)0x0) {
    LOCK();
    iVar1 = *local_2d8;
    *local_2d8 = *local_2d8 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_2c0 == (long *)0x0) {
        if (local_2e0._vptr_Allocator != (_func_int **)0x0) {
          free(local_2e0._vptr_Allocator);
        }
      }
      else {
        (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0._vptr_Allocator);
      }
    }
  }
  pAVar4->_vptr_Allocator = (_func_int **)0x0;
  pAVar4[2]._vptr_Allocator = (_func_int **)0x0;
  *(undefined4 *)&pAVar4[3]._vptr_Allocator = 0;
  *(undefined4 *)&pAVar4[5]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar4[5]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar4[6]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar4[6]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar4[7]._vptr_Allocator = 0;
  pAVar4[8]._vptr_Allocator = (_func_int **)0x0;
  pAVar4[1]._vptr_Allocator = (_func_int **)0x0;
  ppvVar3 = &local_288;
  if (local_280 != (int *)0x0) {
    LOCK();
    iVar1 = *local_280;
    *local_280 = *local_280 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_268 == (long *)0x0) {
        if (local_288 != (void *)0x0) {
          free(local_288);
        }
      }
      else {
        (**(code **)(*local_268 + 0x18))(local_268,local_288);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}